

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_tools.cc
# Opt level: O0

Ptr __thiscall core::image::int_to_byte_image(image *this,ConstPtr *image)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int chans;
  invalid_argument *this_00;
  TypedImageBase<unsigned_char> *this_01;
  ImageBase *pIVar4;
  TypedImageBase<int> *this_02;
  element_type *this_03;
  int *piVar5;
  element_type *this_04;
  uchar *puVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ptr PVar7;
  int local_38 [3];
  int local_2c;
  undefined1 local_25;
  int i;
  ConstPtr *local_18;
  ConstPtr *image_local;
  Ptr *img;
  
  local_18 = image;
  image_local = (ConstPtr *)this;
  bVar1 = std::operator==(image,(nullptr_t)0x0);
  if (bVar1) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Null image given");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_25 = 0;
  Image<unsigned_char>::create();
  this_01 = &std::
             __shared_ptr_access<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this)->super_TypedImageBase<unsigned_char>;
  pIVar4 = (ImageBase *)
           std::
           __shared_ptr_access<const_core::Image<int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_core::Image<int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)image);
  iVar2 = ImageBase::width(pIVar4);
  pIVar4 = (ImageBase *)
           std::
           __shared_ptr_access<const_core::Image<int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_core::Image<int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)image);
  iVar3 = ImageBase::height(pIVar4);
  pIVar4 = (ImageBase *)
           std::
           __shared_ptr_access<const_core::Image<int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_core::Image<int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)image);
  chans = ImageBase::channels(pIVar4);
  TypedImageBase<unsigned_char>::allocate(this_01,iVar2,iVar3,chans);
  local_2c = 0;
  while( true ) {
    iVar2 = local_2c;
    this_02 = &std::
               __shared_ptr_access<const_core::Image<int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_core::Image<int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)image)->super_TypedImageBase<int>;
    iVar3 = TypedImageBase<int>::get_value_amount(this_02);
    if (iVar3 <= iVar2) break;
    this_03 = std::
              __shared_ptr_access<const_core::Image<int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<const_core::Image<int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)image);
    piVar5 = Image<int>::at(this_03,local_2c);
    local_38[2] = *piVar5;
    if (local_38[2] < 1) {
      local_38[2] = -local_38[2];
    }
    local_38[1] = 0;
    local_38[0] = 0xff;
    piVar5 = math::clamp<int>(local_38 + 2,local_38 + 1,local_38);
    iVar2 = *piVar5;
    this_04 = std::
              __shared_ptr_access<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)this);
    puVar6 = Image<unsigned_char>::at(this_04,local_2c);
    *puVar6 = (uchar)iVar2;
    local_2c = local_2c + 1;
  }
  PVar7.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  PVar7.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Ptr)PVar7.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ByteImage::Ptr
int_to_byte_image (IntImage::ConstPtr image)
{
    if (image == nullptr)
        throw std::invalid_argument("Null image given");

    ByteImage::Ptr img = ByteImage::create();
    img->allocate(image->width(), image->height(), image->channels());
    for (int i = 0; i < image->get_value_amount(); ++i)
    {
        img->at(i) = math::clamp(std::abs(image->at(i)), 0, 255);
    }
    return img;
}